

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

void * SoapySDRDevice_getNativeDeviceHandle(SoapySDRDevice *device)

{
  void *pvVar1;
  long *in_RDI;
  exception *ex;
  
  SoapySDRDevice_clearError();
  pvVar1 = (void *)(**(code **)(*in_RDI + 0x3c8))();
  return pvVar1;
}

Assistant:

void* SoapySDRDevice_getNativeDeviceHandle(const SoapySDRDevice *device)
{
    __SOAPY_SDR_C_TRY
    return device->getNativeDeviceHandle();
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}